

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTSHarness.cpp
# Opt level: O2

void __thiscall BaseHarnessHandlers::printFile(BaseHarnessHandlers *this,XMLURL *url)

{
  bool bVar1;
  int iVar2;
  XMLCh *pXVar3;
  long *plVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  XMLByte buffer [256];
  
  pXVar3 = xercesc_4_0::XMLURL::getURLText(url);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,L"file://dummy/");
  if (!bVar1) {
    plVar4 = (long *)xercesc_4_0::XMLURL::makeNewStream();
    if (plVar4 == (long *)0x0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"File ");
      pXVar3 = xercesc_4_0::XMLURL::getURLText(url);
      StrX::StrX((StrX *)buffer,pXVar3);
      std::operator<<(poVar5,(char *)buffer._0_8_);
      poVar5 = std::operator<<(poVar5," is missing");
      std::endl<char,std::char_traits<char>>(poVar5);
      StrX::~StrX((StrX *)buffer);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Content of file ");
      pXVar3 = xercesc_4_0::XMLURL::getURLText(url);
      StrX::StrX((StrX *)buffer,pXVar3);
      std::operator<<(poVar5,(char *)buffer._0_8_);
      std::endl<char,std::char_traits<char>>(poVar5);
      StrX::~StrX((StrX *)buffer);
      while( true ) {
        lVar6 = (**(code **)(*plVar4 + 0x18))(plVar4,(StrX *)buffer,0xff);
        if (lVar6 == 0) break;
        buffer[lVar6] = '\0';
        uVar7 = 0;
        do {
          iVar2 = xercesc_4_0::XMLString::indexOf
                            ((char *)buffer,'\r',uVar7,
                             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          if (iVar2 == -1) break;
          uVar7 = (ulong)iVar2;
          lVar6 = xercesc_4_0::XMLString::stringLen((char *)(buffer + uVar7 + 1));
          memmove(buffer + uVar7,buffer + uVar7 + 1,lVar6 + 1);
        } while (buffer[uVar7] != '\0');
        std::operator<<((ostream *)&std::cout,(char *)buffer);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      (**(code **)(*plVar4 + 8))();
    }
  }
  return;
}

Assistant:

void BaseHarnessHandlers::printFile(XMLURL& url)
{
    if(XMLString::equals(url.getURLText(), dummy))
        return;
    BinInputStream* stream=url.makeNewStream();
    if(stream==NULL)
    {
        std::cout << "File " << StrX(url.getURLText()) << " is missing" << std::endl;
        return;
    }
    std::cout << "Content of file " << StrX(url.getURLText()) << std::endl;
    XMLByte buffer[256];
    XMLSize_t nRead;
    while((nRead=stream->readBytes(buffer, 255)) >0)
    {
        buffer[nRead]=0;
        // sending data containing \n\r to cout generates \n\n\r, so strip any \r
        XMLSize_t idx=0;
        while(true)
        {
            int cr=XMLString::indexOf((const char*)buffer, '\r', idx);
            if(cr==-1)
                break;
            memmove(&buffer[cr], &buffer[cr+1], XMLString::stringLen((const char*)&buffer[cr+1])+1);
            idx=cr;
            if(buffer[idx]==0)
                break;
        }
        std::cout << (const char*)buffer;
    }
    std::cout << std::endl;
    delete stream;
}